

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O2

cmUVProcessChain __thiscall cmUVProcessChainBuilder::Start(cmUVProcessChainBuilder *this)

{
  pointer pPVar1;
  StdioConfiguration this_00;
  bool bVar2;
  ulong uVar3;
  cmUVProcessChainBuilder *in_RSI;
  long lVar4;
  size_t i;
  ulong index;
  
  std::make_unique<cmUVProcessChain::InternalData>();
  bVar2 = cmUVProcessChain::InternalData::Prepare((InternalData *)(this->Stdio)._M_elems[0],in_RSI);
  if (bVar2) {
    lVar4 = 0;
    index = 0;
    while( true ) {
      pPVar1 = (in_RSI->Processes).
               super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = ((long)(in_RSI->Processes).
                     super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1) / 0x18;
      this_00 = (this->Stdio)._M_elems[0];
      if (uVar3 <= index) break;
      cmUVProcessChain::InternalData::SpawnProcess
                ((InternalData *)this_00,index,
                 (ProcessConfiguration *)
                 ((long)&(pPVar1->Arguments).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar4),index == 0,index == uVar3 - 1);
      index = index + 1;
      lVar4 = lVar4 + 0x18;
    }
    cmUVProcessChain::InternalData::Finish((InternalData *)this_00);
  }
  return (unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
          )(unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
            )this;
}

Assistant:

cmUVProcessChain cmUVProcessChainBuilder::Start() const
{
  cmUVProcessChain chain;

  if (!chain.Data->Prepare(this)) {
    return chain;
  }

  for (std::size_t i = 0; i < this->Processes.size(); i++) {
    chain.Data->SpawnProcess(i, this->Processes[i], i == 0,
                             i == this->Processes.size() - 1);
  }

  chain.Data->Finish();

  return chain;
}